

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmElementSegment.cpp
# Opt level: O0

void __thiscall Wasm::WasmElementSegment::Init(WasmElementSegment *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  uint *puVar5;
  TrackAllocData local_38;
  WasmElementSegment *local_10;
  WasmElementSegment *this_local;
  
  local_10 = this;
  if (this->m_numElem == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmElementSegment.cpp"
                       ,0x18,"(m_numElem > 0)","m_numElem > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pAVar4 = &this->m_alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&unsigned_int::typeinfo,0,(ulong)this->m_numElem,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmElementSegment.cpp"
             ,0x19);
  pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar4,&local_38);
  puVar5 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                     ((Memory *)pAVar4,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (ulong)this->m_numElem);
  this->m_elems = puVar5;
  memset(this->m_elems,0xff,(ulong)this->m_numElem << 2);
  return;
}

Assistant:

void WasmElementSegment::Init()
    {
        Assert(m_numElem > 0);
        m_elems = AnewArray(m_alloc, uint32, m_numElem);
        memset(m_elems, Js::Constants::UninitializedValue, m_numElem * sizeof(uint32));
    }